

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_table_concat(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  TRef TVar2;
  TRef TVar3;
  TRef TVar4;
  IROp op;
  jit_State *in_RDI;
  TRef tr;
  TRef hdr;
  TRef tre;
  TRef tri;
  TRef sep;
  TRef tab;
  undefined4 in_stack_ffffffffffffff98;
  TRef in_stack_ffffffffffffff9c;
  jit_State *in_stack_ffffffffffffffa0;
  jit_State *pjVar5;
  undefined2 in_stack_ffffffffffffffa8;
  IRRef1 IVar6;
  IRType in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar7;
  IRRef1 IVar8;
  TRef TVar9;
  TRef TVar10;
  
  uVar1 = *in_RDI->base;
  if ((uVar1 & 0x1f000000) == 0xb000000) {
    if ((in_RDI->base[1] & 0x1f000000) == 0) {
      TVar2 = lj_ir_knull((jit_State *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                          ,in_stack_ffffffffffffffac);
    }
    else {
      TVar2 = lj_ir_tostr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    uVar7 = TVar2;
    if ((in_RDI->base[1] == 0) || ((in_RDI->base[2] & 0x1f000000) == 0)) {
      TVar3 = lj_ir_kint((jit_State *)CONCAT44(TVar2,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
    }
    else {
      TVar3 = lj_opt_narrow_toint((jit_State *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    TVar10 = TVar3;
    if (((in_RDI->base[1] == 0) || (in_RDI->base[2] == 0)) || ((in_RDI->base[3] & 0x1f000000) == 0))
    {
      TVar4 = lj_ir_call(in_RDI,IRCALL_lj_tab_len,(ulong)uVar1);
    }
    else {
      TVar4 = lj_opt_narrow_toint((jit_State *)
                                  CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    TVar9 = TVar4;
    op = recff_bufhdr(in_stack_ffffffffffffffa0);
    TVar2 = lj_ir_call(in_RDI,IRCALL_lj_buf_puttab,(ulong)op,(ulong)uVar1,(ulong)TVar2,(ulong)TVar10
                       ,TVar9);
    pjVar5 = in_RDI;
    IVar6 = (IRRef1)TVar2;
    TVar3 = lj_ir_kptr_((jit_State *)CONCAT44(TVar10,TVar9),op,(void *)CONCAT44(uVar7,TVar3));
    IVar8 = (IRRef1)op;
    (pjVar5->fold).ins.field_0.ot = 0x989;
    (pjVar5->fold).ins.field_0.op1 = IVar6;
    (pjVar5->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold((jit_State *)CONCAT44(TVar4,CONCAT22(IVar6,in_stack_ffffffffffffffa8)));
    (in_RDI->fold).ins.field_0.ot = 0x5504;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (in_RDI->fold).ins.field_0.op2 = IVar8;
    TVar2 = lj_opt_fold((jit_State *)CONCAT44(TVar4,CONCAT22(IVar6,in_stack_ffffffffffffffa8)));
    *in_RDI->base = TVar2;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_table_concat(jit_State *J, RecordFFData *rd)
{
  TRef tab = J->base[0];
  if (tref_istab(tab)) {
    TRef sep = !tref_isnil(J->base[1]) ?
	       lj_ir_tostr(J, J->base[1]) : lj_ir_knull(J, IRT_STR);
    TRef tri = (J->base[1] && !tref_isnil(J->base[2])) ?
	       lj_opt_narrow_toint(J, J->base[2]) : lj_ir_kint(J, 1);
    TRef tre = (J->base[1] && J->base[2] && !tref_isnil(J->base[3])) ?
	       lj_opt_narrow_toint(J, J->base[3]) :
	       lj_ir_call(J, IRCALL_lj_tab_len, tab);
    TRef hdr = recff_bufhdr(J);
    TRef tr = lj_ir_call(J, IRCALL_lj_buf_puttab, hdr, tab, sep, tri, tre);
    emitir(IRTG(IR_NE, IRT_PTR), tr, lj_ir_kptr(J, NULL));
    J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
  }  /* else: Interpreter will throw. */
  UNUSED(rd);
}